

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varset.h
# Opt level: O0

VarSet * __thiscall libDAI::VarSet::operator/(VarSet *this,VarSet *ns)

{
  insert_iterator<std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> __result;
  iterator __last1;
  VarSet *in_RDI;
  insert_iterator<std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_> iVar1;
  VarSet *res;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffff48;
  iterator in_stack_ffffffffffffff50;
  vector<libDAI::Var,_std::allocator<libDAI::Var>_> *in_stack_ffffffffffffff88;
  _Iter in_stack_ffffffffffffff90;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
  in_stack_ffffffffffffffa0;
  
  VarSet((VarSet *)in_stack_ffffffffffffff50._M_current);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffff48);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffff48);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffff48);
  std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::end(in_stack_ffffffffffffff48);
  __last1 = std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>::begin(in_stack_ffffffffffffff48)
  ;
  iVar1 = std::inserter<std::vector<libDAI::Var,std::allocator<libDAI::Var>>>
                    (in_stack_ffffffffffffff48,in_stack_ffffffffffffff50);
  __result.iter._M_current = in_stack_ffffffffffffff90._M_current;
  __result.container = in_stack_ffffffffffffff88;
  std::
  set_difference<__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,__gnu_cxx::__normal_iterator<libDAI::Var_const*,std::vector<libDAI::Var,std::allocator<libDAI::Var>>>,std::insert_iterator<std::vector<libDAI::Var,std::allocator<libDAI::Var>>>>
            ((Var *)iVar1.container,
             (__normal_iterator<const_libDAI::Var_*,_std::vector<libDAI::Var,_std::allocator<libDAI::Var>_>_>
              )__last1._M_current,in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,__result);
  calcStateSpace(in_RDI);
  return in_RDI;
}

Assistant:

VarSet operator/ (const VarSet& ns) const {
                VarSet res;
                std::set_difference( _vars.begin(), _vars.end(), ns._vars.begin(), ns._vars.end(), inserter( res._vars, res._vars.begin() ) );
                res.calcStateSpace();
#ifdef DEBUG
                assert( is_sorted( res._vars.begin(), res._vars.end() ) );
#endif
                return res;
            }